

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O2

void bitmap_copy(bitmap_t dst,const_bitmap_t src)

{
  size_t sVar1;
  size_t size;
  bitmap_el_t *__dest;
  bitmap_el_t *__src;
  
  sVar1 = VARR_bitmap_el_tlength(dst);
  size = VARR_bitmap_el_tlength(src);
  if (sVar1 < size) {
    bitmap_expand(dst,size << 6);
  }
  else {
    VARR_bitmap_el_ttrunc(dst,size);
  }
  __dest = VARR_bitmap_el_taddr(dst);
  __src = VARR_bitmap_el_taddr(src);
  memcpy(__dest,__src,size << 3);
  return;
}

Assistant:

static inline void bitmap_copy (bitmap_t dst, const_bitmap_t src) {
  size_t dst_len = VARR_LENGTH (bitmap_el_t, dst);
  size_t src_len = VARR_LENGTH (bitmap_el_t, src);

  if (dst_len >= src_len)
    VARR_TRUNC (bitmap_el_t, dst, src_len);
  else
    bitmap_expand (dst, src_len * BITMAP_WORD_BITS);
  memcpy (VARR_ADDR (bitmap_el_t, dst), VARR_ADDR (bitmap_el_t, src),
          src_len * sizeof (bitmap_el_t));
}